

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *key;
  
  if (argc == 3) {
    pcVar2 = argv[1];
    iVar1 = strncmp(pcVar2,"start",5);
    if (iVar1 == 0) {
      pcVar2 = argv[2];
      key = "ctl.start";
    }
    else {
      iVar1 = strncmp(pcVar2,"stop",4);
      if (iVar1 != 0) {
        main_cold_2();
        goto LAB_001012cf;
      }
      pcVar2 = argv[2];
      key = "ctl.stop";
    }
    property_set(key,pcVar2);
    iVar1 = 0;
  }
  else {
    main_cold_1();
LAB_001012cf:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
    if(argc != 3) {
        fprintf(stderr,"usage: service start/stop <svc>\n");
        return 1;
    }


    if(strncmp(argv[1],"start", 5) == 0){
		    property_set("ctl.start", argv[2]);	
    } else if(strncmp(argv[1],"stop", 4) == 0){
		    property_set("ctl.stop", argv[2]);
    } else {
        fprintf(stderr,"usage: service start/stop <svc>\n");
        return 1;
    }
    return 0;
}